

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O3

void __thiscall
QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate
          (QFileSystemComboBoxPrivate *this,QFileSystemComboBox *widgetP)

{
  QFileSystemComboBox *pQVar1;
  QFileSystemListView *pQVar2;
  QFileSystemComboBoxPrivate *this_00;
  QCompleter *this_01;
  QAbstractItemModel *pQVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  undefined8 extraout_RAX;
  CaseSensitivity CVar6;
  QFileSystemComboBoxPrivate *this_02;
  code *local_60;
  undefined8 local_58;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  QObject local_28 [8];
  
  QObject::QObject(&this->super_QObject,(QObject *)widgetP);
  *(undefined ***)this = &PTR_metaObject_001ab100;
  this->widget = widgetP;
  this_00 = (QFileSystemComboBoxPrivate *)operator_new(0x30);
  this_02 = this_00;
  QFileSystemListView::QFileSystemListView((QFileSystemListView *)this_00,(QWidget *)widgetP);
  this->view = (QFileSystemListView *)this_00;
  this->initialSorting = true;
  (this->layoutValue).super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_engaged = false;
  if (this->widget != (QFileSystemComboBox *)0x0) {
    QFileSystemListView::setBrowsable((QFileSystemListView *)this_00,false);
    QFileSystemListView::setReadOnly(this->view,true);
    QObject::blockSignals(SUB81(this->widget,0));
    QComboBox::setEditable(SUB81(this->widget,0));
    pQVar1 = this->widget;
    QAbstractItemView::model();
    QComboBox::setModel((QAbstractItemModel *)pQVar1);
    QComboBox::setView((QAbstractItemView *)this->widget);
    pQVar1 = this->widget;
    QAbstractItemView::rootIndex();
    QComboBox::setRootModelIndex((QModelIndex *)pQVar1);
    QComboBox::setCurrentIndex((int)this->widget);
    this_01 = (QCompleter *)operator_new(0x10);
    pQVar3 = (QAbstractItemModel *)QAbstractItemView::model();
    QCompleter::QCompleter(this_01,pQVar3,&this->super_QObject);
    *(undefined ***)this_01 = &PTR_metaObject_001ab188;
    CVar6 = (CaseSensitivity)this_01;
    QCompleter::setCaseSensitivity(CVar6);
    QCompleter::setCompletionRole(CVar6);
    QCompleter::setFilterMode(this_01,1);
    QCompleter::setModelSorting(CVar6);
    QComboBox::setCompleter((QCompleter *)this->widget);
    ppvVar4 = (void **)QComboBox::model();
    pQVar1 = this->widget;
    local_60 = QAbstractItemModel::layoutAboutToBeChanged;
    local_58 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp:58:98),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(QFileSystemComboBoxPrivate **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_28,ppvVar4,(QObject *)&local_60,(void **)pQVar1,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_28);
    ppvVar4 = (void **)QComboBox::model();
    pQVar1 = this->widget;
    local_60 = QAbstractItemModel::layoutChanged;
    local_58 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp:63:89),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(QFileSystemComboBoxPrivate **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_30,ppvVar4,(QObject *)&local_60,(void **)pQVar1,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_30);
    pQVar2 = this->view;
    local_60 = QFileSystemListView::directoryLoaded;
    local_58 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp:97:68),_1,_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(QFileSystemComboBoxPrivate **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_38,(void **)pQVar2,(QObject *)&local_60,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    pQVar2 = this->view;
    local_60 = QFileSystemListView::rootPathChanged;
    local_58 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp:105:68),_1,_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(QFileSystemComboBoxPrivate **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_40,(void **)pQVar2,(QObject *)&local_60,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    pQVar1 = this->widget;
    local_60 = QComboBox::currentIndexChanged;
    local_58 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp:110:80),_1,_QtPrivate::List<int>,_void>
         ::impl;
    *(QFileSystemComboBoxPrivate **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_48,(void **)pQVar1,(QObject *)&local_60,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    return;
  }
  QFileSystemComboBoxPrivate(this_02);
  operator_delete(this_00,0x30);
  QObject::~QObject(&this->super_QObject);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

explicit QFileSystemComboBoxPrivate(QFileSystemComboBox *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , view(new QFileSystemListView(widget)) {
        Q_ASSERT(widget);

        view->setBrowsable(false);
        view->setReadOnly(true);

        widget->blockSignals(true);
        widget->QComboBox::setEditable(true);
        widget->QComboBox::setModel(view->model());
        widget->QComboBox::setView(view);
        widget->QComboBox::setRootModelIndex(view->rootIndex());
        widget->QComboBox::setCurrentIndex(-1);

        auto completer = new QFileSystemComboBoxCompleter(view->model(), this);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionRole(Qt::DisplayRole);
        completer->setFilterMode(Qt::MatchContains);
        completer->setModelSorting(QCompleter::CaseInsensitivelySortedModel);
        widget->setCompleter(completer);

        // QFileSystemModel sorting is delayed and use layoutChanged.
        // And QComboBox model watching does not listen to layoutChanged...

        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutAboutToBeChanged, widget, [this]() {
            if (!initialSorting && !layoutValue) {
                layoutValue = qMakePair(widget->currentIndex(), QFileInfo(widget->currentFilePath()));
            }
        });
        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutChanged, widget, [this]() {
            if (initialSorting && !layoutValue && widget->QComboBox::model()->rowCount(widget->QComboBox::rootModelIndex()) > 0) {
                layoutValue = qMakePair(0, QFileInfo(widget->filePath(0)));
            }

            initialSorting = false;

            bool done = false;

            if (layoutValue) {
                Q_ASSERT(layoutValue->second.filePath().isEmpty() || view->rootPath() == layoutValue->second.path());

                // If we have both a valid index and file path, both needs to match
                if (layoutValue->first >= 0 && !layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (layoutValue->first >= 0) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (!layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(widget->findFileName(layoutValue->second.fileName()));
                } else {
                    Q_UNREACHABLE();
                }
            }

            layoutValue.reset();

            if (!done) {
                widget->QComboBox::setCurrentIndex(-1);
            }
        });

        connect(view, &QFileSystemListView::directoryLoaded, this, [this](const QString &path) {
            if (widget->signalsBlocked()) {
                widget->blockSignals(false);
            }

            Q_EMIT widget->directoryLoaded(path);
        });

        connect(view, &QFileSystemListView::rootPathChanged, this, [this](const QString &path) {
            widget->QComboBox::setRootModelIndex(view->rootIndex());
            Q_EMIT widget->rootPathChanged(path);
        });

        connect(widget, qOverload<int>(&QComboBox::currentIndexChanged), this, [this](int index) {
            Q_EMIT widget->currentFileNameChanged(widget->fileName(index));
            Q_EMIT widget->currentFilePathChanged(widget->filePath(index));
        });
    }